

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.hpp
# Opt level: O0

int __thiscall uv::Loop::init(Loop *this,EVP_PKEY_CTX *ctx)

{
  int e;
  uv_loop_t *puVar1;
  uv_loop_t *in_RDX;
  error_code eVar2;
  undefined4 uStack_44;
  undefined4 uStack_34;
  int status;
  error_code *ec_local;
  bool is_default_local;
  Loop *this_local;
  
  if (((ulong)ctx & 1) == 0) {
    this->loop_ptr_ = &this->loop_;
    e = uv_loop_init(this->loop_ptr_);
    if (e != 0) {
      eVar2 = makeErrorCode(e);
      in_RDX->data = (void *)CONCAT44(uStack_34,eVar2._M_value);
      *(error_category **)&in_RDX->active_handles = eVar2._M_cat;
      goto LAB_00105573;
    }
  }
  else {
    puVar1 = (uv_loop_t *)uv_default_loop();
    this->loop_ptr_ = puVar1;
  }
  if (this->loop_ptr_ == (uv_loop_t *)0x0) {
    eVar2 = makeErrorCode(0xc);
    in_RDX->data = (void *)CONCAT44(uStack_44,eVar2._M_value);
    *(error_category **)&in_RDX->active_handles = eVar2._M_cat;
  }
  else {
    in_RDX = this->loop_ptr_;
    in_RDX->data = this;
  }
LAB_00105573:
  return (int)in_RDX;
}

Assistant:

inline void Loop::init(bool is_default, std::error_code & ec)
	{
		if (is_default) {
			loop_ptr_ = uv_default_loop();
		}
		else {
			loop_ptr_ = &loop_;
			auto status = uv_loop_init(loop_ptr_);
			if (status != 0) {
				ec = makeErrorCode(status);
				return;
			}
		}

		if (loop_ptr_ == nullptr) {
			ec = makeErrorCode(ENOMEM);
			return;
		}

		loop_ptr_->data = this;
	}